

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O0

void __thiscall amrex::BoxArray::clear_hash_bin(BoxArray *this)

{
  bool bVar1;
  element_type *peVar2;
  
  std::__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x126d67c);
  bVar1 = std::
          unordered_map<amrex::IntVect,_std::vector<int,_std::allocator<int>_>,_amrex::IntVect::shift_hasher,_std::equal_to<amrex::IntVect>,_std::allocator<std::pair<const_amrex::IntVect,_std::vector<int,_std::allocator<int>_>_>_>_>
          ::empty((unordered_map<amrex::IntVect,_std::vector<int,_std::allocator<int>_>,_amrex::IntVect::shift_hasher,_std::equal_to<amrex::IntVect>,_std::allocator<std::pair<const_amrex::IntVect,_std::vector<int,_std::allocator<int>_>_>_>_>
                   *)0x126d688);
  if (!bVar1) {
    std::__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x126d69a);
    std::
    unordered_map<amrex::IntVect,_std::vector<int,_std::allocator<int>_>,_amrex::IntVect::shift_hasher,_std::equal_to<amrex::IntVect>,_std::allocator<std::pair<const_amrex::IntVect,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::clear((unordered_map<amrex::IntVect,_std::vector<int,_std::allocator<int>_>,_amrex::IntVect::shift_hasher,_std::equal_to<amrex::IntVect>,_std::allocator<std::pair<const_amrex::IntVect,_std::vector<int,_std::allocator<int>_>_>_>_>
             *)0x126d6a6);
    peVar2 = std::__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x126d6b4);
    peVar2->has_hashmap = false;
  }
  return;
}

Assistant:

void
BoxArray::clear_hash_bin () const
{
    if (!m_ref->hash.empty())
    {
#ifdef AMREX_MEM_PROFILING
        m_ref->updateMemoryUsage_hash(-1);
#endif
        m_ref->hash.clear();
        m_ref->has_hashmap = false;
    }
}